

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::get_6(disp *this,int a,int b,int c,int d,int e,int f)

{
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ts<int>(&local_70,a);
  std::operator+(&local_110,"get_6",&local_70);
  ts<int>(&local_130,b);
  std::operator+(&local_f0,&local_110,&local_130);
  ts<int>(&local_150,c);
  std::operator+(&local_d0,&local_f0,&local_150);
  ts<int>(&local_170,d);
  std::operator+(&local_b0,&local_d0,&local_170);
  ts<int>(&local_190,e);
  std::operator+(&local_90,&local_b0,&local_190);
  ts<int>(&local_1b0,f);
  std::operator+(&local_50,&local_90,&local_1b0);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void get_6(int a,int b,int c,int d,int e,int f) { v_="get_6" + ts(a)+ts(b)+ts(c)+ts(d)+ts(e)+ts(f); }